

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::sparse::(anonymous_namespace)::IndexBufferTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
::createInstance(InstanceFactory1<vkt::sparse::(anonymous_namespace)::IndexBufferTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
                 *this,Context *context)

{
  IndexBufferTestInstance *this_00;
  Context *context_local;
  InstanceFactory1<vkt::sparse::(anonymous_namespace)::IndexBufferTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
  *this_local;
  
  this_00 = (IndexBufferTestInstance *)operator_new(0x1a0);
  sparse::anon_unknown_0::IndexBufferTestInstance::IndexBufferTestInstance
            (this_00,context,this->m_arg0);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }